

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImDrawList *pIVar10;
  undefined8 uVar11;
  uint uVar12;
  ImU32 IVar13;
  ImU32 IVar14;
  int iVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  byte bVar16;
  char cVar17;
  ImVec2 *out_r;
  uint uVar18;
  long lVar19;
  ImGuiContext *g;
  ulong uVar20;
  undefined4 uVar21;
  bool bVar22;
  uint uVar23;
  int iVar24;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar25;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  int iVar28;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  int iVar29;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float V;
  float B;
  float G;
  float R;
  ImVec2 current_off_unrotated;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float vv;
  float uu;
  ImVec2 picker_pos;
  float ww;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_21c;
  float local_218;
  float local_214;
  uint local_210;
  float local_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  ImVec4 local_1c8;
  ImVec2 *local_1b0;
  ImVec2 local_1a8;
  uint local_1a0;
  float local_19c;
  ImVec2 local_198;
  ImVec2 local_190;
  float local_188;
  float fStack_184;
  uint uStack_180;
  uint uStack_17c;
  ImVec2 local_178;
  undefined8 uStack_170;
  ImVec2 local_168;
  ImVec2 local_160;
  undefined1 local_158 [8];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [8];
  ImVec2 local_140;
  float local_138;
  float fStack_134;
  uint uStack_130;
  uint uStack_12c;
  ImDrawList *local_128;
  ImVec2 local_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  ImVec2 local_e0;
  ImGuiWindow *local_d8;
  ImU32 local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  size_t local_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar31 [16];
  
  pIVar6 = GImGui;
  local_f8._8_8_ = local_f8._0_8_;
  local_d8 = GImGui->CurrentWindow;
  local_d8->WriteAccessed = true;
  if (local_d8->SkipItems != false) {
    bVar16 = 0;
    goto LAB_0017cde4;
  }
  local_128 = local_d8->DrawList;
  local_178 = (ImVec2)ref_col;
  local_208._0_4_ = CalcItemWidth();
  local_208._4_4_ = extraout_XMM0_Db;
  fStack_200 = (float)extraout_XMM0_Dc;
  fStack_1fc = (float)extraout_XMM0_Dd;
  (pIVar6->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar18 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar18);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar12 = pIVar6->ColorEditOptions & 0x6000000;
    uVar23 = 0x2000000;
    if (uVar12 != 0) {
      uVar23 = uVar12;
    }
    uVar18 = uVar18 | uVar23;
  }
  if ((uVar18 & 0x18000000) == 0) {
    uVar12 = pIVar6->ColorEditOptions & 0x18000000;
    uVar23 = 0x8000000;
    if (uVar12 != 0) {
      uVar23 = uVar12;
    }
    uVar18 = uVar18 | uVar23;
  }
  uVar23 = (uVar18 & 0x6000000) - 1;
  if ((uVar18 & 0x6000000 ^ uVar23) <= uVar23) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar23 = (uVar18 & 0x18000000) - 1;
  if ((uVar18 & 0x18000000 ^ uVar23) <= uVar23) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115e,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  local_f8._0_8_ = label;
  if ((uVar18 & 8) == 0) {
    uVar18 = uVar18 | pIVar6->ColorEditOptions & 0x10000U;
  }
  local_1a0 = uVar18 & 0x10002;
  bVar22 = local_1a0 == 0x10000;
  IVar25 = (local_d8->DC).CursorPos;
  local_1b0 = (ImVec2 *)col;
  local_120 = IVar25;
  local_138 = GetFrameHeight();
  out_r = local_1b0;
  fVar36 = (pIVar6->Style).ItemInnerSpacing.x;
  local_118 = ZEXT416((uint)fVar36);
  fVar36 = (float)local_208._0_4_ - (local_138 + fVar36) * (float)(byte)(bVar22 + 1);
  uVar23 = -(uint)(fVar36 <= local_138);
  fStack_184 = (float)(local_208._4_4_ & (uint)extraout_XMM0_Db_00);
  uStack_180 = (uint)fStack_200 & extraout_XMM0_Dc_00;
  uStack_17c = (uint)fStack_1fc & extraout_XMM0_Dd_00;
  local_188 = (float)(uVar23 & (uint)local_138 | ~uVar23 & (uint)fVar36);
  local_a0 = (ulong)((uVar18 & 2) == 0) * 4 + 0xc;
  fStack_134 = extraout_XMM0_Db_00;
  uStack_130 = extraout_XMM0_Dc_00;
  uStack_12c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_1b0,local_a0);
  local_20c = local_188 * 0.08;
  local_88 = ZEXT416((uint)(local_188 * 0.5));
  local_190.x = local_188 * 0.5 - local_20c;
  _local_b8 = ZEXT416((uint)local_190.x);
  local_19c = IVar25.x;
  local_68 = local_188 + local_19c;
  fStack_64 = fStack_184;
  uStack_60 = uStack_180;
  uStack_5c = uStack_17c;
  _fStack_1e0 = 0;
  local_1e8._0_4_ = IVar25.x;
  local_1e8._4_4_ = IVar25.y;
  fVar36 = (local_138 + local_188) * 0.5 + local_19c;
  fVar40 = local_188 * 0.5 + IVar25.y;
  fStack_100 = fStack_134 * 0.0 + 0.0;
  fStack_fc = fStack_184 * 0.0 + 0.0;
  local_108 = (ImVec2 *)CONCAT44(fVar40,fVar36);
  local_1a8.y = fVar40;
  local_1a8.x = fVar36;
  local_190.x = local_190.x - (float)(int)(local_188 * 0.027);
  local_160.x = local_190.x * -0.5;
  local_160.y = local_190.x * -0.866025;
  local_190.y = 0.0;
  local_198.y = local_190.x * 0.866025;
  local_21c = out_r->x;
  local_218 = out_r->y;
  local_214 = out_r[1].x;
  local_208._4_4_ = local_118._4_4_;
  local_208._0_4_ = (float)local_118._0_4_ + local_68;
  fStack_200 = (float)local_118._8_4_;
  fStack_1fc = (float)local_118._12_4_;
  local_1d4 = local_214;
  local_1d0 = local_218;
  local_1cc = local_21c;
  local_198.x = local_160.x;
  if ((uVar18 >> 0x1b & 1) == 0) {
    fVar36 = (float)local_118._0_4_ + local_68;
    if ((uVar18 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_21c,local_218,local_214,&local_1cc,&local_1d0,&local_1d4);
      goto LAB_0017b6dd;
    }
  }
  else {
    ColorConvertRGBtoHSV(local_21c,local_218,local_214,&local_21c,&local_218,&local_214);
LAB_0017b6dd:
    fVar36 = (float)local_208._0_4_;
  }
  local_1f8._4_4_ = fStack_134;
  local_1f8._0_4_ = local_138 + fVar36;
  fStack_1f0 = (float)uStack_130;
  fStack_1ec = (float)uStack_12c;
  PushItemFlag(8,true);
  if ((uVar18 >> 0x1a & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) == 0) {
      auVar4._12_4_ = 0;
      auVar4._0_12_ = stack0xfffffffffffffeac;
      _local_158 = auVar4 << 0x20;
      local_210 = 0;
      uVar20 = 0;
    }
    else {
      local_1c8.y = local_188;
      local_1c8.x = local_188;
      InvisibleButton("sv",(ImVec2 *)&local_1c8);
      bVar22 = IsItemActive();
      if (bVar22) {
        auVar30._0_4_ = local_188 + -1.0;
        IVar25 = (pIVar6->IO).MousePos;
        auVar26._0_4_ = IVar25.x - (float)local_1e8._0_4_;
        auVar26._4_4_ = IVar25.y - (float)local_1e8._4_4_;
        auVar26._8_4_ = 0.0 - fStack_1e0;
        auVar26._12_4_ = 0.0 - fStack_1dc;
        auVar30._4_4_ = auVar30._0_4_;
        auVar30._8_4_ = auVar30._0_4_;
        auVar30._12_4_ = auVar30._0_4_;
        auVar27 = divps(auVar26,auVar30);
        fVar36 = auVar27._4_4_;
        iVar15 = -(uint)(1.0 < auVar27._0_4_);
        iVar24 = -(uint)(1.0 < fVar36);
        auVar32._4_4_ = iVar24;
        auVar32._0_4_ = iVar15;
        auVar32._8_4_ = iVar24;
        auVar32._12_4_ = iVar24;
        auVar31._8_8_ = auVar32._8_8_;
        auVar31._4_4_ = iVar15;
        auVar31._0_4_ = iVar15;
        uVar23 = movmskpd((int)CONCAT71(extraout_var,bVar22),auVar31);
        auVar39 = ZEXT816(0x3f800000);
        if ((uVar23 & 1) == 0) {
          auVar39 = auVar27;
        }
        local_218 = (float)(~-(uint)(auVar27._0_4_ < 0.0) & auVar39._0_4_);
        fVar40 = 0.0;
        if ((uVar23 & 2) == 0) {
          fVar40 = 1.0 - fVar36;
        }
        local_214 = (float)(-(uint)(fVar36 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar36 < 0.0) & (uint)fVar40);
        local_158._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar23 >> 8),1);
      }
      else {
        auVar5._12_4_ = 0;
        auVar5._0_12_ = stack0xfffffffffffffeac;
        _local_158 = auVar5 << 0x20;
      }
      if ((uVar18 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_1c8.y = (float)local_1e8._4_4_;
      local_1c8.x = (float)local_208._0_4_;
      SetCursorScreenPos((ImVec2 *)&local_1c8);
      local_1c8.y = local_188;
      local_1c8.x = local_138;
      InvisibleButton("hue",(ImVec2 *)&local_1c8);
      bVar22 = IsItemActive();
      if (bVar22) {
        fVar36 = ((pIVar6->IO).MousePos.y - (float)local_1e8._4_4_) / (local_188 + -1.0);
        local_21c = 1.0;
        if (fVar36 <= 1.0) {
          local_21c = fVar36;
        }
        local_21c = (float)(~-(uint)(fVar36 < 0.0) & (uint)local_21c);
        local_210 = (uint)CONCAT71(extraout_var_00,1);
        uVar20 = 1;
      }
      else {
        local_210 = 0;
        uVar20 = (ulong)(uint)local_158._0_4_;
      }
    }
  }
  else {
    local_1c8.y = local_188;
    local_1c8.x = (pIVar6->Style).ItemInnerSpacing.x + local_188 + local_138;
    InvisibleButton("hsv",(ImVec2 *)&local_1c8);
    bVar22 = IsItemActive();
    if (bVar22) {
      fVar41 = (pIVar6->IO).MouseClickedPos[0].x - (float)local_108;
      fVar42 = (pIVar6->IO).MouseClickedPos[0].y - local_108._4_4_;
      fVar40 = (pIVar6->IO).MousePos.x - (float)local_108;
      local_c8 = ZEXT416((uint)fVar40);
      fVar36 = (pIVar6->IO).MousePos.y - local_108._4_4_;
      _local_98 = ZEXT416((uint)fVar36);
      _local_158 = ZEXT416((uint)fVar42);
      local_78 = ZEXT416((uint)fVar41);
      fVar42 = fVar41 * fVar41 + fVar42 * fVar42;
      if ((fVar42 < ((float)local_b8._0_4_ + -1.0) * ((float)local_b8._0_4_ + -1.0)) ||
         (((float)local_88._0_4_ + 1.0) * ((float)local_88._0_4_ + 1.0) < fVar42)) {
        local_210 = 0;
      }
      else {
        fVar36 = atan2f(fVar36,fVar40);
        fVar36 = (fVar36 / 3.1415927) * 0.5;
        local_21c = (float)(~-(uint)(fVar36 < 0.0) & (uint)fVar36 |
                           (uint)(fVar36 + 1.0) & -(uint)(fVar36 < 0.0));
        local_210 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar36 = cosf(local_21c * -2.0 * 3.1415927);
      local_108 = (ImVec2 *)CONCAT44(extraout_XMM0_Db_01,fVar36);
      fStack_100 = extraout_XMM0_Dc_01;
      fStack_fc = extraout_XMM0_Dd_01;
      fVar36 = sinf(local_21c * -2.0 * 3.1415927);
      fVar40 = -(float)local_158._0_4_;
      fVar42 = (float)local_108 * (float)local_158._0_4_;
      local_158._4_4_ = extraout_XMM0_Db_02;
      local_158._0_4_ = fVar36;
      uStack_150 = extraout_XMM0_Dc_02;
      uStack_14c = extraout_XMM0_Dd_02;
      local_1c8.x = (float)local_108 * (float)local_78._0_4_ + fVar40 * fVar36;
      local_1c8.y = fVar36 * (float)local_78._0_4_ + fVar42;
      bVar22 = ImTriangleContainsPoint(&local_190,&local_160,&local_198,(ImVec2 *)&local_1c8);
      if (bVar22) {
        local_1c8.x = (float)local_108 * (float)local_c8._0_4_ +
                      -(float)local_98._0_4_ * (float)local_158._0_4_;
        local_1c8.y = (float)local_158._0_4_ * (float)local_c8._0_4_ +
                      (float)local_108 * (float)local_98._0_4_;
        bVar22 = ImTriangleContainsPoint(&local_190,&local_160,&local_198,(ImVec2 *)&local_1c8);
        if (!bVar22) {
          local_1c8._0_8_ =
               ImTriangleClosestPoint(&local_190,&local_160,&local_198,(ImVec2 *)&local_1c8);
        }
        ImTriangleBarycentricCoords
                  (&local_190,&local_160,&local_198,(ImVec2 *)&local_1c8,(float *)local_148,
                   &local_168.x,&local_e0.x);
        fVar40 = 1.0 - local_168.x;
        fVar36 = 1.0;
        if (fVar40 <= 1.0) {
          fVar36 = fVar40;
        }
        local_214 = (float)(-(uint)(fVar40 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar40 < 0.0001) & (uint)fVar36);
        fVar40 = (float)local_148._0_4_ / local_214;
        fVar36 = 1.0;
        if (fVar40 <= 1.0) {
          fVar36 = fVar40;
        }
        local_218 = (float)(-(uint)(fVar40 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar40 < 0.0001) & (uint)fVar36);
        local_158._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar20 = 1;
        out_r = local_1b0;
      }
      else {
        auVar27._12_4_ = 0;
        auVar27._0_12_ = stack0xfffffffffffffeac;
        _local_158 = auVar27 << 0x20;
        uVar20 = (ulong)local_210;
      }
    }
    else {
      auVar39._12_4_ = 0;
      auVar39._0_12_ = stack0xfffffffffffffeac;
      _local_158 = auVar39 << 0x20;
      local_210 = 0;
      uVar20 = 0;
    }
    if ((uVar18 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_118._0_4_ = (float)local_118._0_4_ + (float)local_1f8._0_4_;
  if (local_1a0 == 0x10000) {
    local_1c8.y = (float)local_1e8._4_4_;
    local_1c8.x = (float)local_118._0_4_;
    SetCursorScreenPos((ImVec2 *)&local_1c8);
    local_1c8.y = local_188;
    local_1c8.x = local_138;
    InvisibleButton("alpha",(ImVec2 *)&local_1c8);
    bVar22 = IsItemActive();
    if (bVar22) {
      fVar40 = ((pIVar6->IO).MousePos.y - (float)local_1e8._4_4_) / (local_188 + -1.0);
      fVar36 = 1.0;
      if (fVar40 <= 1.0) {
        fVar36 = fVar40;
      }
      out_r[1].y = (float)(-(uint)(fVar40 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar40 < 0.0) & (uint)(1.0 - fVar36));
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar18 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar6->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (-1 < (char)uVar18) {
    local_108 = (ImVec2 *)CONCAT44(local_108._4_4_,uVar18);
    uVar11 = local_f8._0_8_;
    text_end = FindRenderedTextEnd((char *)local_f8._0_8_,(char *)0x0);
    uVar18 = (uint)(float)local_108;
    if (text_end != (char *)uVar11) {
      if (((uint)(float)local_108 >> 8 & 1) != 0) {
        SameLine(0.0,(pIVar6->Style).ItemInnerSpacing.x);
      }
      TextEx((char *)local_f8._0_8_,text_end,0);
    }
  }
  if ((uVar18 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1c8._0_8_ = *out_r;
    if ((uVar18 & 2) == 0) {
      local_1c8.w = out_r[1].y;
    }
    else {
      local_1c8.w = 1.0;
    }
    local_1c8.z = out_r[1].x;
    if ((char)uVar18 < '\0') {
      Text("Current");
    }
    IVar25.x = local_138 * 3.0;
    IVar25.y = local_138 * 2.0;
    local_f8._8_4_ = local_138 * 0.0;
    local_f8._0_4_ = IVar25.x;
    local_f8._4_4_ = IVar25.y;
    local_f8._12_4_ = local_138 * 0.0;
    ColorButton("##current",&local_1c8,uVar18 & 0x180e0040,IVar25);
    if (local_178 != (ImVec2)0x0) {
      Text("Original");
      local_148 = *(undefined1 (*) [8])local_178;
      if ((uVar18 & 2) == 0) {
        local_140.y = *(float *)((long)local_178 + 0xc);
      }
      else {
        local_140.y = 1.0;
      }
      local_140.x = *(float *)((long)local_178 + 8);
      bVar22 = ColorButton("##original",(ImVec4 *)local_148,uVar18 & 0x180e0040,
                           (ImVec2)local_f8._0_8_);
      if (bVar22) {
        memcpy(out_r,(void *)local_178,local_a0);
        uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  uVar21 = (undefined4)uVar20;
  fVar36 = local_138 * 0.2;
  fVar40 = 0.0;
  fVar42 = 0.0;
  fVar41 = 0.0;
  if (((char)local_210 != '\0') || (local_158[0] != '\0')) {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        out_r->x = local_21c;
        out_r->y = local_218;
        out_r[1].x = local_214;
      }
    }
    else {
      local_178.y = 0.0;
      local_178.x = fVar36;
      uStack_170 = 0;
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_21c) & (uint)local_21c |
                        (uint)(local_21c + -1e-05) & -(uint)(1.0 <= local_21c)),
                 (float)(~-(uint)(0.0 < local_218) & 0x3727c5ac |
                        (uint)local_218 & -(uint)(0.0 < local_218)),
                 (float)(~-(uint)(0.0 < local_214) & 0x358637bd |
                        (uint)local_214 & -(uint)(0.0 < local_214)),&out_r->x,&out_r->y,&out_r[1].x)
      ;
      fVar36 = local_178.x;
      fVar40 = local_178.y;
      fVar42 = (float)uStack_170;
      fVar41 = uStack_170._4_4_;
    }
  }
  iVar15 = (int)fVar36;
  iVar24 = (int)fVar40;
  iVar28 = (int)fVar42;
  iVar29 = (int)fVar41;
  if ((uVar18 & 0x20) == 0) {
    local_f8._4_4_ = (int)fVar40;
    local_f8._0_4_ = (int)fVar36;
    local_f8._8_4_ = (int)fVar42;
    local_f8._12_4_ = (int)fVar41;
    fVar36 = (float)local_118._0_4_;
    if (local_1a0 != 0x10000) {
      fVar36 = (float)local_208._0_4_;
    }
    local_178 = (ImVec2)&out_r->y;
    local_108 = out_r + 1;
    PushItemWidth((fVar36 + local_138) - local_19c);
    uVar23 = uVar18 & 0x198e001a;
    cVar17 = '\x01';
    if (((uVar18 >> 0x14 & 1) != 0 || (uVar18 & 0x600000) == 0) &&
       (bVar22 = ColorEdit4("##rgb",&out_r->x,uVar23 | 0x100004), bVar22)) {
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
      if (pIVar6->ActiveId == 0) {
        cVar17 = '\x01';
      }
      else {
        cVar17 = pIVar6->ActiveIdAllowOverlap;
      }
    }
    if ((uVar18 >> 0x15 & 1) != 0 || (uVar18 & 0x500000) == 0) {
      bVar22 = ColorEdit4("##hsv",&out_r->x,uVar23 | 0x200004);
      uVar20 = CONCAT71((int7)(uVar20 >> 8),(byte)uVar20 | bVar22);
    }
    uVar21 = (undefined4)uVar20;
    if ((uVar18 >> 0x16 & 1) != 0 || (uVar18 & 0x300000) == 0) {
      bVar22 = ColorEdit4("##hex",&out_r->x,uVar23 | 0x400004);
      uVar21 = (undefined4)CONCAT71((int7)(uVar20 >> 8),(byte)uVar20 | bVar22);
    }
    PopItemWidth();
    IVar25 = local_178;
    out_r = local_1b0;
    if ((uVar18 >> 0x1b & 1) != 0 && cVar17 == '\0') {
      ColorConvertRGBtoHSV
                (local_1b0->x,local_1b0->y,local_1b0[1].x,&local_1c8.x,(float *)local_148,
                 &local_168.x);
      if ((local_1c8.x <= 0.0) && (0.0 < local_21c)) {
        if (0.0 < local_168.x) {
LAB_0017c179:
          if (0.0 < (float)local_148._0_4_) goto LAB_0017c19c;
          fVar36 = local_218 * 0.5;
        }
        else {
          if ((local_214 == local_168.x) && (!NAN(local_214) && !NAN(local_168.x)))
          goto LAB_0017c179;
          local_168.x = local_214 * 0.5;
          fVar36 = local_218;
        }
        ColorConvertHSVtoRGB(local_21c,fVar36,local_168.x,&out_r->x,(float *)IVar25,&local_108->x);
      }
    }
LAB_0017c19c:
    iVar15 = local_f8._0_4_;
    iVar24 = local_f8._4_4_;
    iVar28 = local_f8._8_4_;
    iVar29 = local_f8._12_4_;
  }
  local_98._4_4_ = (float)iVar24;
  local_98._0_4_ = (float)iVar15;
  fStack_90 = (float)iVar28;
  fStack_8c = (float)iVar29;
  if ((char)uVar21 != '\0') {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        local_21c = out_r->x;
        local_218 = out_r->y;
        local_214 = out_r[1].x;
        ColorConvertHSVtoRGB(local_21c,local_218,local_214,&local_1cc,&local_1d0,&local_1d4);
      }
    }
    else {
      local_1cc = out_r->x;
      local_1d0 = out_r->y;
      local_1d4 = out_r[1].x;
      ColorConvertRGBtoHSV(local_1cc,local_1d0,local_1d4,&local_21c,&local_218,&local_214);
    }
  }
  local_78._0_4_ = uVar21;
  local_1c8.x = 1.0;
  local_1c8.y = 1.0;
  local_1c8.z = 1.0;
  local_1c8.w = 1.0;
  ColorConvertHSVtoRGB
            (local_21c,1.0,1.0,&local_1c8.x,(float *)((long)&local_1c8 + 4),
             (float *)((long)&local_1c8 + 8));
  IVar13 = ColorConvertFloat4ToU32(&local_1c8);
  local_148._4_4_ = local_1d0;
  local_148._0_4_ = local_1cc;
  local_140.y = 1.0;
  local_140.x = local_1d4;
  IVar14 = ColorConvertFloat4ToU32((ImVec4 *)local_148);
  pIVar10 = local_128;
  local_168.x = 0.0;
  local_168.y = 0.0;
  if ((uVar18 >> 0x1a & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) != 0) {
      local_c8._0_4_ = IVar14;
      local_148._4_4_ = (float)local_1e8._4_4_ + local_188;
      local_148._0_4_ = local_68;
      ImDrawList::AddRectFilledMultiColor
                (local_128,&local_120,(ImVec2 *)local_148,0xffffffff,IVar13,IVar13,0xffffffff);
      local_1e8._4_4_ = local_188;
      local_1e8._0_4_ = local_188;
      fStack_1e0 = local_188;
      fStack_1dc = local_188;
      local_148._0_4_ = local_120.x + local_188;
      local_148._4_4_ = local_120.y + local_188;
      ImDrawList::AddRectFilledMultiColor
                (pIVar10,&local_120,(ImVec2 *)local_148,0,0,0xff000000,0xff000000);
      p_max.x = (float)local_1e8._0_4_ + local_120.x;
      p_max.y = (float)local_1e8._4_4_ + local_120.y;
      RenderFrameBorder(local_120,p_max,0.0);
      auVar37._4_4_ = 1.0 - local_214;
      auVar37._0_4_ = local_218;
      auVar37._8_8_ = 0;
      auVar39 = minps(_DAT_0018d890,auVar37);
      fVar36 = local_120.x;
      fVar40 = local_120.y;
      auVar33._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_218) & auVar39._0_4_) * (float)local_1e8._0_4_
                        + fVar36 + 0.5);
      auVar33._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_214) & auVar39._4_4_) *
                        (float)local_1e8._4_4_ + fVar40 + 0.5);
      auVar33._8_4_ = (float)(int)(auVar39._8_4_ * fStack_1e0 + 0.0 + 0.0);
      auVar33._12_4_ = (float)(int)(auVar39._12_4_ * fStack_1dc + 0.0 + 0.0);
      auVar38._0_4_ = (float)local_1e8._0_4_ + fVar36 + -2.0;
      auVar38._4_4_ = (float)local_1e8._4_4_ + fVar40 + -2.0;
      auVar38._8_4_ = fStack_1e0 + 0.0 + 0.0;
      auVar38._12_4_ = fStack_1dc + 0.0 + 0.0;
      auVar39 = minps(auVar38,auVar33);
      uVar18 = -(uint)(auVar33._0_4_ < fVar36 + 2.0);
      uVar23 = -(uint)(auVar33._4_4_ < fVar40 + 2.0);
      local_168 = (ImVec2)(CONCAT44(~uVar23 & auVar39._4_4_,~uVar18 & auVar39._0_4_) |
                          CONCAT44((uint)(fVar40 + 2.0) & uVar23,(uint)(fVar36 + 2.0) & uVar18));
      local_1e8._4_4_ = fStack_184;
      local_1e8._0_4_ = local_188 / 6.0;
      fStack_1e0 = (float)uStack_180;
      fStack_1dc = (float)uStack_17c;
      lVar19 = 0;
      IVar14 = 0xff0000ff;
      do {
        local_148._4_4_ = (float)(int)lVar19 * (float)local_1e8._0_4_ + local_120.y;
        local_148._0_4_ = local_208._0_4_;
        lVar1 = lVar19 + 1;
        local_e0.y = (float)(int)lVar1 * (float)local_1e8._0_4_ + local_120.y;
        local_e0.x = (float)local_1f8._0_4_;
        IVar13 = (&DAT_001a1c44)[lVar19];
        ImDrawList::AddRectFilledMultiColor
                  (pIVar10,(ImVec2 *)local_148,&local_e0,IVar14,IVar14,IVar13,IVar13);
        lVar19 = lVar1;
        IVar14 = IVar13;
      } while (lVar1 != 6);
      _local_1e8 = ZEXT416((uint)(float)(int)(local_21c * local_188 + local_120.y + 0.5));
      p_min.y = local_120.y;
      p_min.x = (float)local_208._0_4_;
      p_max_00.y = local_188 + local_120.y;
      p_max_00.x = (float)local_1f8._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_208._0_4_ + -1.0;
      pos.y = (float)local_1e8._0_4_;
      half_sz.x = (float)local_98._0_4_ + 1.0;
      half_sz.y = (float)local_98._0_4_;
      RenderArrowsForVerticalBar(pIVar10,pos,half_sz,local_138 + 2.0);
      out_r = local_1b0;
      goto LAB_0017cb9d;
    }
  }
  else {
    local_c8._0_4_ = IVar14;
    local_19c = 5.60519e-45;
    if (4 < (int)(float)local_88._0_4_ / 0xc) {
      local_19c = (float)((int)(float)local_88._0_4_ / 0xc);
    }
    local_f8 = ZEXT416((uint)(1.5 / (float)local_88._0_4_));
    local_68 = -(1.5 / (float)local_88._0_4_);
    fStack_64 = -0.0;
    uStack_60 = 0x80000000;
    uStack_5c = 0x80000000;
    local_88._0_4_ = (float)local_88._0_4_ + (float)local_b8._0_4_;
    local_108 = (ImVec2 *)CONCAT44(local_108._4_4_,(float)local_88._0_4_ * 0.5);
    local_b8._4_4_ = local_b8._0_4_;
    fStack_b0 = (float)local_b8._0_4_;
    fStack_ac = (float)local_b8._0_4_;
    lVar19 = 0;
    local_cc = IVar13;
    do {
      fVar36 = (float)(int)lVar19 / 6.0;
      fVar36 = (fVar36 + fVar36) * 3.1415927 + local_68;
      local_178.x = fVar36;
      fVar40 = ((float)(int)lVar19 + 1.0) / 6.0;
      fVar40 = (fVar40 + fVar40) * 3.1415927 + (float)local_f8._0_4_;
      local_1e8._0_4_ = fVar40;
      iVar15 = (pIVar10->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar10,&local_1a8,(float)local_108,fVar36,fVar40,(int)local_19c);
      ImDrawList::AddPolyline
                (pIVar10,(pIVar10->_Path).Data,(pIVar10->_Path).Size,0xffffffff,false,local_20c);
      (pIVar10->_Path).Size = 0;
      iVar24 = (pIVar10->VtxBuffer).Size;
      _local_1f8 = ZEXT416((uint)local_1a8.x);
      local_208._0_4_ = cosf(local_178.x);
      local_208._4_4_ = extraout_XMM0_Db_03;
      fStack_200 = (float)extraout_XMM0_Dc_03;
      fStack_1fc = (float)extraout_XMM0_Dd_03;
      auVar34._4_4_ = local_1a8.y;
      auVar34._0_4_ = local_1f8._0_4_;
      auVar34._8_4_ = local_1f8._4_4_;
      auVar34._12_4_ = 0;
      _local_1f8 = auVar34;
      fVar36 = sinf(local_178.x);
      fVar40 = (float)local_208._4_4_ * fStack_b0;
      local_208._4_4_ = fVar36 * (float)local_b8._4_4_ + (float)local_1f8._4_4_;
      local_208._0_4_ = (float)local_208._0_4_ * (float)local_b8._0_4_ + (float)local_1f8._0_4_;
      fStack_200 = fVar40 + fStack_1f0;
      fStack_1fc = extraout_XMM0_Db_04 * fStack_ac + fStack_1ec;
      _local_1f8 = ZEXT416((uint)local_1a8.x);
      local_178.x = cosf((float)local_1e8._0_4_);
      local_178.y = extraout_XMM0_Db_05;
      uStack_170 = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
      auVar35._4_4_ = local_1a8.y;
      auVar35._0_4_ = local_1f8._0_4_;
      auVar35._8_4_ = local_1f8._4_4_;
      auVar35._12_4_ = 0;
      _local_1f8 = auVar35;
      fVar36 = sinf((float)local_1e8._0_4_);
      gradient_p1.x = local_178.x * (float)local_b8._0_4_ + (float)local_1f8._0_4_;
      gradient_p1.y = fVar36 * (float)local_b8._4_4_ + (float)local_1f8._4_4_;
      lVar1 = lVar19 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar10,iVar15,iVar24,(ImVec2)local_208,gradient_p1,(&DAT_001a1c40)[lVar19],
                 (&DAT_001a1c44)[lVar19]);
      lVar19 = lVar1;
    } while (lVar1 != 6);
    local_208._0_4_ = cosf((local_21c + local_21c) * 3.1415927);
    local_208._4_4_ = extraout_XMM0_Db_06;
    fStack_200 = (float)extraout_XMM0_Dc_05;
    fStack_1fc = (float)extraout_XMM0_Dd_05;
    local_1f8._0_4_ = sinf((local_21c + local_21c) * 3.1415927);
    IVar14 = local_cc;
    pIVar10 = local_128;
    out_r = local_1b0;
    local_1f8._4_4_ = extraout_XMM0_Db_07;
    fStack_1f0 = (float)extraout_XMM0_Dc_06;
    fStack_1ec = (float)extraout_XMM0_Dd_06;
    local_148._0_4_ = (float)local_208._0_4_ * (float)local_88._0_4_ * 0.5 + local_1a8.x;
    local_148._4_4_ = (float)local_1f8._0_4_ * (float)local_88._0_4_ * 0.5 + local_1a8.y;
    if ((char)local_210 == '\0') {
      fVar36 = 0.55;
    }
    else {
      fVar36 = 0.65;
    }
    local_20c = local_20c * fVar36;
    iVar15 = 0x20;
    if ((int)(local_20c / 1.4) < 0x20) {
      iVar15 = (int)(local_20c / 1.4);
    }
    iVar24 = 9;
    if (9 < iVar15) {
      iVar24 = iVar15;
    }
    ImDrawList::AddCircleFilled(local_128,(ImVec2 *)local_148,local_20c,local_cc,iVar24);
    ImDrawList::AddCircle(pIVar10,(ImVec2 *)local_148,local_20c + 1.0,0xff808080,iVar24,1.0);
    ImDrawList::AddCircle(pIVar10,(ImVec2 *)local_148,local_20c,0xffffffff,iVar24,1.0);
    uVar8 = local_1f8._0_4_;
    uVar9 = local_1f8._4_4_;
    uVar21 = local_208._0_4_;
    uVar7 = local_208._4_4_;
    fVar36 = (float)local_208._4_4_ * 0.0;
    fVar40 = (float)local_208._4_4_ * 0.0;
    local_1e8._0_4_ = local_1a8.x;
    local_e0.x = local_190.x * (float)local_208._0_4_ + -local_190.y * (float)local_1f8._0_4_ +
                 (float)local_1e8._0_4_;
    local_1e8._4_4_ = local_1a8.y;
    local_e0.y = local_190.x * (float)local_1f8._0_4_ + local_190.y * (float)local_208._0_4_ +
                 (float)local_1e8._4_4_;
    local_208._4_4_ = local_e0.y;
    local_208._0_4_ = local_e0.x;
    fStack_200 = (float)local_1f8._4_4_ * 0.0 + (float)local_1f8._4_4_ * -0.0 + 0.0;
    fStack_1fc = fVar40 + fVar36 + 0.0;
    fVar36 = (float)local_1f8._4_4_ * -0.0;
    fVar42 = (float)local_1f8._4_4_ * 0.0;
    fVar40 = local_160.x * (float)uVar21 + -local_160.y * (float)local_1f8._0_4_ +
             (float)local_1e8._0_4_;
    local_1f8._4_4_ =
         local_160.x * (float)local_1f8._0_4_ + local_160.y * (float)uVar21 + (float)local_1e8._4_4_
    ;
    local_1f8._0_4_ = fVar40;
    fStack_1f0 = fVar42 + fVar36 + 0.0;
    fStack_1ec = (float)uVar7 * 0.0 + (float)uVar7 * 0.0 + 0.0;
    local_38.y = (float)local_1f8._4_4_;
    local_38.x = fVar40;
    local_1e8._0_4_ =
         local_198.x * (float)uVar21 + -local_198.y * (float)uVar8 + (float)local_1e8._0_4_;
    local_1e8._4_4_ =
         local_198.x * (float)uVar8 + local_198.y * (float)uVar21 + (float)local_1e8._4_4_;
    fStack_1e0 = (float)uVar9 * 0.0 + (float)uVar9 * -0.0 + 0.0;
    fStack_1dc = (float)uVar7 * 0.0 + (float)uVar7 * 0.0 + 0.0;
    local_40.y = (float)local_1e8._4_4_;
    local_40.x = (float)local_1e8._0_4_;
    local_178 = GetFontTexUvWhitePixel();
    uStack_170 = extraout_XMM0_Qb;
    ImDrawList::PrimReserve(pIVar10,6,6);
    auVar5 = _local_1e8;
    auVar27 = _local_1f8;
    auVar39 = _local_208;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)pIVar10->_VtxCurrentIdx;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3 = pIVar10->_VtxWritePtr;
    (pIVar3->pos).x = (float)local_208._0_4_;
    (pIVar3->pos).y = (float)local_208._4_4_;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = IVar14;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    uVar18 = pIVar10->_VtxCurrentIdx + 1;
    pIVar10->_VtxCurrentIdx = uVar18;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar18;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1f8._0_4_;
    pIVar3[1].pos.y = (float)local_1f8._4_4_;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = IVar14;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    uVar18 = pIVar10->_VtxCurrentIdx + 1;
    pIVar10->_VtxCurrentIdx = uVar18;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar18;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1e8._0_4_;
    pIVar3[1].pos.y = (float)local_1e8._4_4_;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = 0xffffffff;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    uVar18 = pIVar10->_VtxCurrentIdx + 1;
    pIVar10->_VtxCurrentIdx = uVar18;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar18;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_208._0_4_;
    pIVar3[1].pos.y = (float)local_208._4_4_;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = 0;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    uVar18 = pIVar10->_VtxCurrentIdx + 1;
    pIVar10->_VtxCurrentIdx = uVar18;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar18;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1f8._0_4_;
    pIVar3[1].pos.y = (float)local_1f8._4_4_;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = 0xff000000;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    uVar18 = pIVar10->_VtxCurrentIdx + 1;
    pIVar10->_VtxCurrentIdx = uVar18;
    pIVar2 = pIVar10->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar18;
    pIVar10->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_40;
    pIVar10->_VtxWritePtr->uv = local_178;
    pIVar3 = pIVar10->_VtxWritePtr;
    pIVar3->col = 0;
    pIVar10->_VtxWritePtr = pIVar3 + 1;
    pIVar10->_VtxCurrentIdx = pIVar10->_VtxCurrentIdx + 1;
    _local_208 = auVar39;
    _local_1f8 = auVar27;
    _local_1e8 = auVar5;
    ImDrawList::AddTriangle(pIVar10,&local_e0,&local_38,&local_40,0xff808080,1.5);
    fVar36 = 1.0;
    if (local_218 <= 1.0) {
      fVar36 = local_218;
    }
    fVar36 = (float)(~-(uint)(local_218 < 0.0) & (uint)fVar36);
    fVar42 = 1.0 - local_214;
    fVar40 = 1.0;
    if (fVar42 <= 1.0) {
      fVar40 = fVar42;
    }
    fVar40 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar40);
    fVar42 = fVar36 * (local_e0.x - local_40.x) + local_40.x;
    fVar36 = fVar36 * (local_e0.y - local_40.y) + local_40.y;
    local_168.x = fVar40 * (local_38.x - fVar42) + fVar42;
    local_168.y = fVar40 * (local_38.y - fVar36) + fVar36;
LAB_0017cb9d:
    IVar14 = local_c8._0_4_;
  }
  pIVar10 = local_128;
  if (local_158[0] == '\0') {
    fVar36 = 6.0;
  }
  else {
    fVar36 = 10.0;
  }
  local_208._0_4_ = fVar36;
  ImDrawList::AddCircleFilled(local_128,&local_168,fVar36,IVar14,0xc);
  ImDrawList::AddCircle(pIVar10,&local_168,(float)local_208._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(pIVar10,&local_168,(float)local_208._0_4_,0xffffffff,0xc,1.0);
  if (local_1a0 == 0x10000) {
    fVar36 = out_r[1].y;
    _local_1f8 = ZEXT416((uint)fVar36);
    fVar40 = 1.0;
    if (fVar36 <= 1.0) {
      fVar40 = fVar36;
    }
    _local_208 = ZEXT416((uint)(1.0 - fVar40));
    local_148._4_4_ = local_120.y;
    local_148._0_4_ = local_118._0_4_;
    local_140.x = (float)local_118._0_4_ + local_138;
    local_140.y = local_120.y + local_188;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_148,local_140,0,(local_140.x - (float)local_118._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar10,(ImVec2 *)local_148,&local_140,IVar14,IVar14,IVar14 & 0xffffff,
               IVar14 & 0xffffff);
    local_208._4_4_ = (float)(int)(float)(~local_1f8._4_4_ & local_208._4_4_);
    local_208._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1f8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1f8._0_4_ < 0.0) & local_208._0_4_) * local_188 +
                      local_120.y + 0.5);
    fStack_200 = (float)(int)(float)(~(uint)fStack_1f0 & (uint)fStack_200);
    fStack_1fc = (float)(int)(float)(~(uint)fStack_1ec & (uint)fStack_1fc);
    RenderFrameBorder((ImVec2)local_148,local_140,0.0);
    pos_00.x = (float)local_118._0_4_ + -1.0;
    pos_00.y = (float)local_208._0_4_;
    half_sz_00.x = (float)local_98._0_4_ + 1.0;
    half_sz_00.y = (float)local_98._0_4_;
    RenderArrowsForVerticalBar(pIVar10,pos_00,half_sz_00,local_138 + 2.0);
  }
  EndGroup();
  uVar21 = local_78._0_4_;
  uVar18 = local_78._0_4_;
  if (local_78[0] != '\0') {
    iVar15 = bcmp(local_58,out_r,local_a0);
    uVar18 = uVar21 & 0xff;
    if (iVar15 == 0) {
      uVar18 = 0;
    }
  }
  bVar16 = (byte)uVar18;
  if ((uVar18 & 1) != 0) {
    MarkItemEdited((local_d8->DC).LastItemId);
  }
  PopID();
LAB_0017cde4:
  return (bool)(bVar16 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}